

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

void __thiscall pbrt::Sphere::readFrom(Sphere *this,BinaryReader *binary)

{
  pointer puVar1;
  size_t sVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  runtime_error *this_00;
  
  Shape::readFrom(&this->super_Shape,binary);
  puVar1 = (binary->currentEntityData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(binary->currentEntityData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar1) <
      binary->currentEntityOffset + 4) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"invalid read attempt by entity - not enough data in data block!");
  }
  else {
    this->radius = *(float *)(puVar1 + binary->currentEntityOffset);
    sVar2 = binary->currentEntityOffset;
    binary->currentEntityOffset = sVar2 + 4;
    puVar1 = (binary->currentEntityData).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (sVar2 + 0x34 <=
        (ulong)((long)(binary->currentEntityData).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1)) {
      uVar3 = *(undefined8 *)(puVar1 + sVar2 + 4);
      uVar4 = *(undefined8 *)(puVar1 + sVar2 + 4 + 8);
      uVar5 = *(undefined8 *)(puVar1 + sVar2 + 0x14);
      uVar6 = *(undefined8 *)(puVar1 + sVar2 + 0x14 + 8);
      uVar7 = *(undefined8 *)(puVar1 + sVar2 + 0x24 + 8);
      *(undefined8 *)&(this->transform).l.vz.z = *(undefined8 *)(puVar1 + sVar2 + 0x24);
      (this->transform).p.y = (float)(int)uVar7;
      (this->transform).p.z = (float)(int)((ulong)uVar7 >> 0x20);
      (this->transform).l.vy.y = (float)(int)uVar5;
      (this->transform).l.vy.z = (float)(int)((ulong)uVar5 >> 0x20);
      (this->transform).l.vz.x = (float)(int)uVar6;
      (this->transform).l.vz.y = (float)(int)((ulong)uVar6 >> 0x20);
      (this->transform).l.vx.x = (float)(int)uVar3;
      (this->transform).l.vx.y = (float)(int)((ulong)uVar3 >> 0x20);
      *(undefined8 *)&(this->transform).l.vx.z = uVar4;
      binary->currentEntityOffset = binary->currentEntityOffset + 0x30;
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"invalid read attempt by entity - not enough data in data block!");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Sphere::readFrom(BinaryReader &binary) 
  {
    Shape::readFrom(binary);
    binary.read(radius);
    binary.read(transform);
  }